

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O2

ArgString * __thiscall
Potassco::ArgString::get<Clasp::RestartSchedule>(ArgString *this,RestartSchedule *x)

{
  char cVar1;
  int iVar2;
  int iVar3;
  KV *pKVar4;
  undefined8 in_RCX;
  char *pcVar5;
  Type fast_00;
  Type slow_00;
  Keep keep;
  bool bVar6;
  ScheduleStrategy SVar7;
  char *local_78;
  Type slow;
  Type fast;
  uint32 sWin;
  uint32 lim;
  pair<unsigned_int,_double> req;
  char *local_50;
  char *local_48;
  Span<Potassco::KV> local_40;
  
  pcVar5 = this->in;
  if (pcVar5 == (char *)0x0) {
    return this;
  }
  cVar1 = *pcVar5;
  bVar6 = cVar1 == this->skip;
  local_78 = pcVar5 + bVar6;
  local_48 = local_78;
  if ((byte)(pcVar5[bVar6] | 0x20U) != 100) {
    iVar3 = Clasp::xconvert(local_78,&x->super_ScheduleStrategy,&local_48,
                            (int)CONCAT71((int7)((ulong)in_RCX >> 8),cVar1));
    local_78 = local_48;
    goto LAB_00127cfa;
  }
  req.first = 0;
  req.second = 0.0;
  lim = 0;
  sWin = 0;
  fast = avg_sma;
  slow = avg_sma;
  local_50 = (char *)0x0;
  if (local_78[1] == ',') {
    iVar3 = 0;
    pcVar5 = (char *)0x0;
    iVar2 = xconvert<unsigned_int,double>(local_78 + 2,&req,&local_78,0);
    if (((iVar2 == 0) || (req.first == 0)) || (req.second <= 0.0)) goto LAB_00127cfa;
    if (*local_78 == ',') {
      iVar3 = 0;
      pcVar5 = (char *)0x0;
      iVar2 = Potassco::xconvert(local_78 + 1,&lim,&local_78,0);
      if (iVar2 == 0) goto LAB_00127cfa;
      if (*local_78 != ',') goto LAB_00127c6b;
      iVar3 = Clasp::xconvert(local_78 + 1,&fast,&local_78,(int)pcVar5);
      fast_00 = fast;
      if (iVar3 == 0) goto LAB_00127cf3;
      iVar3 = (int)CONCAT71((int7)((ulong)pcVar5 >> 8),*local_78);
      keep = keep_never;
      if (fast != avg_sma && *local_78 == ',') {
        local_40.first = (KV *)Clasp::enumMap(Clasp::RestartSchedule::Keep_const*)::map;
        local_40.size = 5;
        pcVar5 = ",";
        pKVar4 = findValue(&local_40,local_78 + 1,&local_50,",");
        if (pKVar4 == (KV *)0x0) {
          keep = keep_never;
        }
        else {
          keep = pKVar4->value;
          local_78 = local_50;
        }
        goto LAB_00127c70;
      }
    }
    else {
LAB_00127c6b:
      fast_00 = avg_sma;
      keep = keep_never;
LAB_00127c70:
      iVar3 = (int)CONCAT71((int7)((ulong)pcVar5 >> 8),*local_78);
    }
    slow_00 = avg_sma;
    if ((char)iVar3 == ',') {
      iVar3 = Clasp::xconvert(local_78 + 1,&slow,&local_78,iVar3);
      slow_00 = slow;
      if (iVar3 == 0) goto LAB_00127cf3;
      if (slow != avg_sma && *local_78 == ',') {
        iVar3 = 0;
        iVar2 = Potassco::xconvert(local_78 + 1,&sWin,&local_78,0);
        if (iVar2 == 0) goto LAB_00127cfa;
      }
    }
    SVar7 = (ScheduleStrategy)
            Clasp::RestartSchedule::dynamic
                      (req.first,(float)req.second,lim,fast_00,keep,slow_00,sWin);
    x->super_ScheduleStrategy = SVar7;
    iVar3 = 1;
  }
  else {
LAB_00127cf3:
    iVar3 = 0;
  }
LAB_00127cfa:
  pcVar5 = (char *)0x0;
  if (iVar3 != 0) {
    pcVar5 = local_78;
  }
  this->in = pcVar5;
  this->skip = ',';
  return this;
}

Assistant:

ArgString& get(T& x)  {
		if (ok()) {
			const char* next = in + (*in == skip);
			in = xconvert(next, x, &next, 0) != 0 ? next : 0;
			skip = ',';
		}
		return *this;
	}